

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureDependenciesFBOIncompleteness2Test::iterate
          (MultisampleTextureDependenciesFBOIncompleteness2Test *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar5;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x6f8))(1,&this->to_id_2d);
  (**(code **)(lVar5 + 0x6f8))(1,&this->to_id_multisample_2d);
  if (bVar2) {
    (**(code **)(lVar5 + 0x6f8))(1,&this->to_id_multisample_2d_array);
  }
  (**(code **)(lVar5 + 0xb8))(0xde1,this->to_id_2d);
  (**(code **)(lVar5 + 0xb8))(0x9100,this->to_id_multisample_2d);
  if (bVar2) {
    (**(code **)(lVar5 + 0xb8))(0x9102,this->to_id_multisample_2d_array);
  }
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up texture objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x163);
  (**(code **)(lVar5 + 0x1310))(0xde1,0,0x8d62,2,2,0,0x1907,0x1401,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexImage2D() call failed for GL_TEXTURE_2D texture target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x16d);
  (**(code **)(lVar5 + 0x1390))(0x9100,2,0x8d62,2,2,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,
                  "glTexStorage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x175);
  if (bVar2) {
    (**(code **)(lVar5 + 0x13a8))(0x9102,2,0x8d62,2,2,2,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,
                    "gltexStorage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x181);
  }
  (**(code **)(lVar5 + 0x6d0))(1,&this->fbo_id);
  (**(code **)(lVar5 + 0x78))(0x8ca9,this->fbo_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up a framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x188);
  (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->to_id_2d,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up zeroth color attachment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x18d);
  (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce1,0x9100,this->to_id_multisample_2d,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up first color attachment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x192);
  iVar3 = (**(code **)(lVar5 + 0x170))(0x8ca9);
  if (iVar3 == 0x8d56) {
    (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce1,0x9100,0,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not detach first color attachment from the draw FBO",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x1a4);
    iVar3 = (**(code **)(lVar5 + 0x170))(0x8ca9);
    if (iVar3 == 0x8cd5) {
      if (bVar2) {
        (**(code **)(lVar5 + 0x6b8))(0x8ca9,0x8ce1,this->to_id_multisample_2d_array,0,0);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"Could not set up first color attachment",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                        ,0x1b7);
        iVar3 = (**(code **)(lVar5 + 0x170))(0x8ca9);
        if (iVar3 != 0x8d56) {
          local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Draw framebuffer\'s completeness status is: ",0x2b);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "as opposed to expected status: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE",0x44);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_130);
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Invalid FBO completeness status reported.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                     ,0x1c2);
          goto LAB_00c88bcb;
        }
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Draw framebuffer\'s completeness status is: ",0x2b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"as opposed to expected status: GL_FRAMEBUFFER_COMPLETE",0x36);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid FBO completeness status reported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x1ae);
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Draw framebuffer\'s completeness status is: ",0x2b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "as opposed to expected status: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid FBO completeness status reported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x19d);
  }
LAB_00c88bcb:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesFBOIncompleteness2Test::iterate()
{
	bool are_2d_ms_array_tos_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up texture objects */
	gl.genTextures(1, &to_id_2d);
	gl.genTextures(1, &to_id_multisample_2d);

	if (are_2d_ms_array_tos_supported)
	{
		gl.genTextures(1, &to_id_multisample_2d_array);
	}

	gl.bindTexture(GL_TEXTURE_2D, to_id_2d);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id_multisample_2d);

	if (are_2d_ms_array_tos_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_multisample_2d_array);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture objects");

	gl.texImage2D(GL_TEXTURE_2D, 0, /* level */
				  GL_RGB565, 2,		/* width */
				  2,				/* height */
				  0,				/* border */
				  GL_RGB,			/* format */
				  GL_UNSIGNED_BYTE, /* type */
				  NULL);			/* pixels */

	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D() call failed for GL_TEXTURE_2D texture target");

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_RGB565, 2,				 /* width */
							   2,							 /* height */
							   GL_FALSE);					 /* fixedsamplelocations */

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glTexStorage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target");

	if (are_2d_ms_array_tos_supported)
	{
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, /* samples */
								   GL_RGB565, 2,						   /* width */
								   2,									   /* height */
								   2,									   /* depth */
								   GL_FALSE);							   /* fixedsamplelocations */

		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"gltexStorage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target");
	}

	/* Set up a framebuffer object */
	gl.genFramebuffers(1, &fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a framebuffer object");

	/* Set up FBO attachments */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, to_id_2d, 0); /* level */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up zeroth color attachment");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_TEXTURE_2D_MULTISAMPLE, to_id_multisample_2d,
							0); /* level */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up first color attachment");

	/* Make sure the draw framebuffer is considered incomplete */
	glw::GLenum fbo_status = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fbo_status != GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Draw framebuffer's completeness status is: " << fbo_status
						   << "as opposed to expected status: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE"
						   << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid FBO completeness status reported.");
	}

	/* Detach the first color attachment */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_TEXTURE_2D_MULTISAMPLE, 0, /* texture */
							0);																		 /* level */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach first color attachment from the draw FBO");

	/* Verify the FBO is now considered complete */
	fbo_status = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fbo_status != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Draw framebuffer's completeness status is: " << fbo_status
						   << "as opposed to expected status: GL_FRAMEBUFFER_COMPLETE" << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid FBO completeness status reported.");
	}

	if (are_2d_ms_array_tos_supported)
	{
		/* Attach the arrayed multisample texture object */
		gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, to_id_multisample_2d_array, 0, /* level */
								   0);																		 /* layer */

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up first color attachment");

		/* Make sure the draw framebuffer is considered incomplete */
		fbo_status = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

		if (fbo_status != GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Draw framebuffer's completeness status is: " << fbo_status
							   << "as opposed to expected status: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FBO completeness status reported.");
		}
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}